

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftwareDriver2_helper.h
# Opt level: O0

void irr::memset32(void *dest,u32 value,size_t bytesize)

{
  size_t i;
  u32 *d;
  size_t bytesize_local;
  u32 value_local;
  void *dest_local;
  
  d = (u32 *)dest;
  for (i = bytesize >> 5; i != 0; i = i - 1) {
    *d = value;
    d[1] = value;
    d[2] = value;
    d[3] = value;
    d[4] = value;
    d[5] = value;
    d[6] = value;
    d[7] = value;
    d = d + 8;
  }
  for (i = bytesize >> 2 & 7; i != 0; i = i - 1) {
    *d = value;
    d = d + 1;
  }
  return;
}

Assistant:

inline void memset32(void *dest, const u32 value, size_t bytesize)
{
	u32 *d = (u32 *)dest;

	size_t i;

	// loops unrolled to reduce the number of increments by factor ~8.
	i = bytesize >> (2 + 3);
	while (i) {
		d[0] = value;
		d[1] = value;
		d[2] = value;
		d[3] = value;

		d[4] = value;
		d[5] = value;
		d[6] = value;
		d[7] = value;

		d += 8;
		i -= 1;
	}

	i = (bytesize >> 2) & 7;
	while (i) {
		d[0] = value;
		d += 1;
		i -= 1;
	}
}